

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  uint *puVar1;
  float *scanline;
  undefined4 uVar2;
  stbtt__point sVar3;
  stbtt__point sVar4;
  undefined4 uVar5;
  stbtt_uint8 sVar6;
  uchar uVar7;
  uchar uVar8;
  byte bVar9;
  byte bVar10;
  stbrp_coord sVar11;
  stbrp_coord sVar12;
  ushort uVar13;
  ushort uVar14;
  undefined2 uVar15;
  undefined2 uVar16;
  undefined4 uVar17;
  undefined1 uVar20;
  stbtt_uint8 *data;
  uint *puVar18;
  undefined6 uVar21;
  undefined4 uVar22;
  ImFont *font;
  stbtt_packedchar *psVar19;
  stbrp_node *psVar23;
  short sVar24;
  short sVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 auVar28 [14];
  unkuint10 Var29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  unkbyte10 Var32;
  undefined1 auVar33 [13];
  undefined1 auVar34 [11];
  undefined1 auVar35 [15];
  undefined1 auVar36 [14];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  uint6 uVar42;
  ImFontBuildSrcData *pIVar43;
  stbtt_uint32 sVar44;
  stbtt_uint32 sVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  uint uVar53;
  stbtt__active_edge *z;
  stbtt_uint32 sVar45;
  stbtt_uint32 sVar46;
  stbtt_uint32 sVar47;
  stbtt_uint32 sVar48;
  undefined4 extraout_var;
  ushort *puVar54;
  stbrp_context *ptr;
  stbrp_node *ptr_00;
  uchar *puVar55;
  void *ptr_01;
  stbtt__edge *p_00;
  float *scanline_00;
  undefined8 *puVar56;
  stbtt__active_edge *psVar57;
  long lVar58;
  stbtt_uint32 *psVar59;
  ushort uVar60;
  ushort uVar61;
  int output_i;
  long lVar62;
  ImWchar *pIVar63;
  long lVar64;
  ulong uVar65;
  stbtt__active_edge *psVar66;
  float *pfVar67;
  int x;
  int iVar68;
  void *p;
  long lVar69;
  stbtt__active_edge *psVar70;
  uchar *puVar71;
  byte *pbVar72;
  int *piVar73;
  stbtt_uint32 encoding_record;
  uint uVar74;
  uint uVar75;
  stbtt__active_edge *psVar76;
  ImFontBuildDstData *pIVar77;
  ulong uVar78;
  stbtt__edge *psVar79;
  long lVar80;
  ulong uVar81;
  ulong uVar82;
  uchar *puVar83;
  byte *pbVar84;
  ImFontConfig *pIVar85;
  int iVar86;
  int iVar87;
  int src_i_1;
  int iVar88;
  ImU32 *it;
  ulong uVar89;
  ImFontBuildSrcData *pIVar90;
  ImFontAtlas *pIVar91;
  int dst_i;
  uchar *puVar92;
  uint codepoint;
  stbtt__edge *psVar93;
  stbrp_rect *psVar94;
  bool bVar95;
  float sum;
  float fVar96;
  float fVar97;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar98 [16];
  undefined4 uVar105;
  undefined1 extraout_var_00 [12];
  undefined4 uVar106;
  undefined4 uVar107;
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar108;
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float in_XMM3_Da;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar117 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  stbtt__buf sVar121;
  float y0_2;
  uint local_49c;
  int local_498;
  int y1;
  ulong local_490;
  undefined8 local_488;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  ImFontAtlas *local_478;
  stbtt_uint32 charstrings;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  undefined1 local_448 [24];
  stbtt__point *local_430;
  stbtt_uint32 fdarrayoff;
  undefined4 uStack_424;
  int local_420;
  float local_41c;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  undefined8 *local_3b0;
  int local_380;
  int y0_1;
  int x0_1;
  int iy0;
  stbrp_context *local_358;
  long local_350;
  stbrp_node *local_348;
  ulong local_340;
  stbtt_packedchar *local_338;
  long local_330;
  long local_328;
  stbtt__edge *local_320;
  ulong local_318;
  ulong local_310;
  float local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  ImFontConfig *local_2f8;
  long local_2f0;
  uchar *local_2e8;
  stbrp_rect *local_2e0;
  long local_2d8;
  long local_2d0;
  size_t local_2c8;
  size_t local_2c0;
  ulong local_2b8;
  int local_2b0;
  int x1_1;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  float local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  int x0;
  undefined4 uStack_234;
  uint uStack_230;
  uint uStack_22c;
  undefined1 auVar100 [16];
  char cVar103;
  char cVar104;
  
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  src_tmp_array.Size = 0;
  src_tmp_array.Capacity = 0;
  src_tmp_array.Data = (ImFontBuildSrcData *)0x0;
  dst_tmp_array.Size = 0;
  dst_tmp_array.Capacity = 0;
  dst_tmp_array.Data = (ImFontBuildDstData *)0x0;
  ImVector<ImFontBuildSrcData>::resize(&src_tmp_array,(atlas->ConfigData).Size);
  ImVector<ImFontBuildDstData>::resize(&dst_tmp_array,(atlas->Fonts).Size);
  lVar69 = 0;
  memset(src_tmp_array.Data,0,(long)src_tmp_array.Size * 0x110);
  memset(dst_tmp_array.Data,0,(long)dst_tmp_array.Size << 5);
  local_478 = atlas;
  while( true ) {
    pIVar90 = src_tmp_array.Data;
    local_2f0 = (long)(local_478->ConfigData).Size;
    if (local_2f0 <= lVar69) break;
    pIVar85 = (local_478->ConfigData).Data + lVar69;
    src_tmp_array.Data[lVar69].DstIndex = -1;
    iVar50 = (local_478->Fonts).Size;
    lVar62 = 0;
    lVar64 = -1;
    while ((iVar52 = (int)lVar64, lVar62 < iVar50 && (iVar52 == -1))) {
      lVar64 = -1;
      if (pIVar85->DstFont == (local_478->Fonts).Data[lVar62]) {
        src_tmp_array.Data[lVar69].DstIndex = (int)lVar62;
        lVar64 = lVar62;
      }
      lVar62 = lVar62 + 1;
    }
    local_448._0_8_ = pIVar85;
    if (iVar52 == -1) goto LAB_0013573d;
    data = (stbtt_uint8 *)pIVar85->FontData;
    iVar50 = pIVar85->FontNo;
    sVar6 = *data;
    if (sVar6 == '\0') {
      sVar49 = 0xffffffff;
      if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_001330ef;
LAB_001330e5:
      sVar49 = -(uint)(iVar50 != 0);
    }
    else {
      sVar49 = 0xffffffff;
      if (sVar6 == 't') {
        sVar6 = data[1];
        if (sVar6 == 'r') {
          if (data[2] == 'u') {
            bVar95 = data[3] == 'e';
            goto LAB_001330e1;
          }
        }
        else if (sVar6 == 't') {
          if ((((data[2] == 'c') && (data[3] == 'f')) &&
              ((sVar44 = ttULONG(data + 4), sVar44 == 0x20000 || (sVar44 == 0x10000)))) &&
             (uVar74 = *(uint *)(data + 8),
             iVar50 < (int)(uVar74 >> 0x18 | (uVar74 & 0xff0000) >> 8 | (uVar74 & 0xff00) << 8 |
                           uVar74 << 0x18))) {
            sVar49 = ttULONG(data + (long)iVar50 * 4 + 0xc);
          }
        }
        else if ((sVar6 == 'y') && (data[2] == 'p')) {
          bVar95 = data[3] == '1';
          goto LAB_001330e1;
        }
      }
      else if (sVar6 == 'O') {
        if ((data[1] == 'T') && (data[2] == 'T')) {
          bVar95 = data[3] == 'O';
          goto LAB_001330e1;
        }
      }
      else if (((sVar6 == '1') && (data[1] == '\0')) && (data[2] == '\0')) {
        bVar95 = data[3] == '\0';
LAB_001330e1:
        if (bVar95) goto LAB_001330e5;
      }
    }
LAB_001330ef:
    pIVar90[lVar69].FontInfo.data = data;
    pIVar90[lVar69].FontInfo.fontstart = sVar49;
    pIVar90[lVar69].FontInfo.cff.data = (uchar *)0x0;
    pIVar90[lVar69].FontInfo.cff.cursor = 0;
    pIVar90[lVar69].FontInfo.cff.size = 0;
    sVar44 = stbtt__find_table(data,sVar49,"cmap");
    local_488 = (ImFontBuildDstData *)CONCAT44(extraout_var,sVar44);
    sVar44 = stbtt__find_table(data,sVar49,"loca");
    pIVar90[lVar69].FontInfo.loca = sVar44;
    sVar45 = stbtt__find_table(data,sVar49,"head");
    pIVar90[lVar69].FontInfo.head = sVar45;
    sVar46 = stbtt__find_table(data,sVar49,"glyf");
    local_490 = CONCAT44(local_490._4_4_,sVar46);
    pIVar90[lVar69].FontInfo.glyf = sVar46;
    sVar46 = stbtt__find_table(data,sVar49,"hhea");
    pIVar90[lVar69].FontInfo.hhea = sVar46;
    sVar47 = stbtt__find_table(data,sVar49,"hmtx");
    pIVar90[lVar69].FontInfo.hmtx = sVar47;
    sVar48 = stbtt__find_table(data,sVar49,"kern");
    pIVar90[lVar69].FontInfo.kern = sVar48;
    sVar48 = stbtt__find_table(data,sVar49,"GPOS");
    pIVar90[lVar69].FontInfo.gpos = sVar48;
    if ((((float)local_488 == 0.0) || (sVar45 == 0)) || ((sVar46 == 0 || (sVar47 == 0))))
    goto LAB_0013573d;
    if ((float)local_490 == 0.0) {
      _charstrings = (stbtt__active_edge *)((ulong)_charstrings & 0xffffffff00000000);
      fdarrayoff = 0;
      buf_packedchars.Size = 2;
      y1 = 0;
      sVar44 = stbtt__find_table(data,sVar49,"CFF ");
      if (sVar44 == 0) goto LAB_0013573d;
      pIVar90[lVar69].FontInfo.fdselect.data = (uchar *)0x0;
      pIVar90[lVar69].FontInfo.fdselect.cursor = 0;
      pIVar90[lVar69].FontInfo.fdselect.size = 0;
      pIVar90[lVar69].FontInfo.fontdicts.data = (uchar *)0x0;
      pIVar90[lVar69].FontInfo.fontdicts.cursor = 0;
      pIVar90[lVar69].FontInfo.fontdicts.size = 0;
      pIVar90[lVar69].FontInfo.cff.data = data + sVar44;
      pIVar90[lVar69].FontInfo.cff.cursor = 0;
      pIVar90[lVar69].FontInfo.cff.size = 0x20000000;
      puVar55 = pIVar90[lVar69].FontInfo.cff.data;
      uVar26 = pIVar90[lVar69].FontInfo.cff.cursor;
      uVar27 = pIVar90[lVar69].FontInfo.cff.size;
      x0 = (int)puVar55;
      uStack_234 = (undefined4)((ulong)puVar55 >> 0x20);
      uVar74 = uVar26 + 2;
      if ((int)uVar27 < (int)(uVar26 + 2)) {
        uVar74 = uVar27;
      }
      if ((int)uVar26 < -2) {
        uVar74 = uVar27;
      }
      uStack_230 = 0;
      if ((int)uVar74 < (int)uVar27) {
        uStack_230 = (uint)puVar55[(int)uVar74];
      }
      if ((int)uVar27 < (int)uStack_230) {
        uStack_230 = uVar27;
      }
      uStack_22c = uVar27;
      stbtt__cff_get_index((stbtt__buf *)&x0);
      sVar121 = stbtt__cff_get_index((stbtt__buf *)&x0);
      buf_rects = (ImVector<stbrp_rect>)stbtt__cff_index_get(sVar121,0);
      stbtt__cff_get_index((stbtt__buf *)&x0);
      sVar121 = stbtt__cff_get_index((stbtt__buf *)&x0);
      pIVar90[lVar69].FontInfo.gsubrs = sVar121;
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x11,1,&charstrings);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x106,1,(stbtt_uint32 *)&buf_packedchars);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x124,1,&fdarrayoff);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x125,1,(stbtt_uint32 *)&y1);
      uVar74 = uStack_22c;
      sVar121.data._4_4_ = uStack_234;
      sVar121.data._0_4_ = x0;
      sVar121.cursor = uStack_230;
      sVar121.size = uStack_22c;
      sVar121 = stbtt__get_subrs(sVar121,(stbtt__buf)buf_rects);
      iVar50 = y1;
      pIVar90[lVar69].FontInfo.subrs = sVar121;
      if ((buf_packedchars.Size != 2) || (sVar44 = charstrings, charstrings == 0))
      goto LAB_0013573d;
      if (fdarrayoff != 0) {
        if (y1 == 0) goto LAB_0013573d;
        uStack_230 = fdarrayoff;
        if ((int)uVar74 < (int)fdarrayoff) {
          uStack_230 = uVar74;
        }
        if ((int)fdarrayoff < 0) {
          uStack_230 = uVar74;
        }
        sVar121 = stbtt__cff_get_index((stbtt__buf *)&x0);
        uVar74 = uStack_22c;
        pIVar90[lVar69].FontInfo.fontdicts = sVar121;
        sVar121 = stbtt__buf_range((stbtt__buf *)&x0,iVar50,uStack_22c - iVar50);
        pIVar90[lVar69].FontInfo.fdselect = sVar121;
      }
      uStack_230 = sVar44;
      if ((int)uVar74 < (int)sVar44) {
        uStack_230 = uVar74;
      }
      if ((int)sVar44 < 0) {
        uStack_230 = uVar74;
      }
      sVar121 = stbtt__cff_get_index((stbtt__buf *)&x0);
      pIVar90[lVar69].FontInfo.charstrings = sVar121;
    }
    else if (sVar44 == 0) goto LAB_0013573d;
    sVar49 = stbtt__find_table(data,sVar49,"maxp");
    if (sVar49 == 0) {
      uVar74 = 0xffff;
    }
    else {
      uVar74 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar49 + 4) << 8 |
                             *(ushort *)(data + (ulong)sVar49 + 4) >> 8);
    }
    pIVar90[lVar69].FontInfo.numGlyphs = uVar74;
    uVar60 = *(ushort *)(data + ((ulong)local_488 & 0xffffffff) + 2);
    pIVar90[lVar69].FontInfo.index_map = 0;
    uVar89 = (ulong)(ushort)(uVar60 << 8 | uVar60 >> 8);
    uVar74 = (int)local_488 + 4;
    iVar50 = 0;
    while( true ) {
      bVar95 = uVar89 == 0;
      uVar89 = uVar89 - 1;
      if (bVar95) break;
      uVar60 = *(ushort *)(data + uVar74) << 8 | *(ushort *)(data + uVar74) >> 8;
      if ((uVar60 == 0) ||
         ((uVar60 == 3 &&
          ((uVar60 = *(ushort *)(data + (ulong)uVar74 + 2) << 8 |
                     *(ushort *)(data + (ulong)uVar74 + 2) >> 8, uVar60 == 10 || (uVar60 == 1))))))
      {
        sVar49 = ttULONG(data + (ulong)uVar74 + 4);
        iVar50 = sVar49 + (int)(float)local_488;
        pIVar90[lVar69].FontInfo.index_map = iVar50;
      }
      uVar74 = uVar74 + 8;
    }
    if (iVar50 == 0) goto LAB_0013573d;
    pIVar90[lVar69].FontInfo.indexToLocFormat =
         (uint)(ushort)(*(ushort *)(data + (long)(int)sVar45 + 0x32) << 8 |
                       *(ushort *)(data + (long)(int)sVar45 + 0x32) >> 8);
    pIVar77 = dst_tmp_array.Data + iVar52;
    pIVar63 = pIVar85->GlyphRanges;
    if (pIVar63 == (ImWchar *)0x0) {
      pIVar63 = ImFontAtlas::GetGlyphRangesDefault::ranges;
    }
    pIVar90[lVar69].SrcRanges = pIVar63;
    for (; *pIVar63 != 0; pIVar63 = pIVar63 + 2) {
      uVar60 = pIVar63[1];
      uVar74 = pIVar90[lVar69].GlyphsHighest;
      if (uVar60 == 0) goto LAB_0013357e;
      uVar75 = (uint)uVar60;
      if ((int)(uint)uVar60 < (int)uVar74) {
        uVar75 = uVar74;
      }
      pIVar90[lVar69].GlyphsHighest = uVar75;
    }
    uVar74 = pIVar90[lVar69].GlyphsHighest;
LAB_0013357e:
    pIVar77->SrcCount = pIVar77->SrcCount + 1;
    if ((int)uVar74 < pIVar77->GlyphsHighest) {
      uVar74 = pIVar77->GlyphsHighest;
    }
    pIVar77->GlyphsHighest = uVar74;
    lVar69 = lVar69 + 1;
  }
  lVar64 = 0;
  auVar110._12_4_ = 0;
  auVar110._0_12_ = local_448._4_12_;
  local_448._0_16_ = auVar110 << 0x20;
  while( true ) {
    pIVar90 = src_tmp_array.Data;
    uVar89 = (ulong)src_tmp_array.Size;
    if ((long)uVar89 <= lVar64) break;
    pIVar77 = dst_tmp_array.Data + src_tmp_array.Data[lVar64].DstIndex;
    ImBitVector::Create(&src_tmp_array.Data[lVar64].GlyphsSet,
                        src_tmp_array.Data[lVar64].GlyphsHighest + 1);
    local_488 = pIVar77;
    if ((pIVar77->GlyphsSet).Storage.Size == 0) {
      ImBitVector::Create(&pIVar77->GlyphsSet,pIVar77->GlyphsHighest + 1);
    }
    pIVar90 = pIVar90 + lVar64;
    pIVar77 = local_488;
    for (puVar54 = pIVar90->SrcRanges;
        (uVar74 = (uint)*puVar54, *puVar54 != 0 && (uVar60 = puVar54[1], uVar60 != 0));
        puVar54 = puVar54 + 2) {
      for (; uVar74 <= uVar60; uVar74 = uVar74 + 1) {
        puVar18 = (pIVar77->GlyphsSet).Storage.Data;
        uVar75 = 1 << ((byte)uVar74 & 0x1f);
        if (((puVar18[uVar74 >> 5] >> (uVar74 & 0x1f) & 1) == 0) &&
           (iVar50 = stbtt_FindGlyphIndex(&pIVar90->FontInfo,uVar74), pIVar77 = local_488,
           iVar50 != 0)) {
          pIVar90->GlyphsCount = pIVar90->GlyphsCount + 1;
          local_488->GlyphsCount = local_488->GlyphsCount + 1;
          uVar89 = (ulong)((uVar74 >> 5) << 2);
          puVar1 = (uint *)((long)(pIVar90->GlyphsSet).Storage.Data + uVar89);
          *puVar1 = *puVar1 | uVar75;
          puVar18 = (uint *)((long)puVar18 + uVar89);
          *puVar18 = *puVar18 | uVar75;
          local_448._0_4_ = local_448._0_4_ + 1;
        }
      }
    }
    lVar64 = lVar64 + 1;
  }
  for (lVar64 = 0; pIVar90 = src_tmp_array.Data, pIVar91 = local_478, lVar64 < (int)uVar89;
      lVar64 = lVar64 + 1) {
    pIVar43 = src_tmp_array.Data + lVar64;
    ImVector<int>::reserve(&pIVar43->GlyphsList,src_tmp_array.Data[lVar64].GlyphsCount);
    pIVar77 = (ImFontBuildDstData *)pIVar90[lVar64].GlyphsSet.Storage.Data;
    local_488 = (ImFontBuildDstData *)(&pIVar77->SrcCount + pIVar90[lVar64].GlyphsSet.Storage.Size);
    iVar50 = 0;
    for (; pIVar77 < local_488; pIVar77 = (ImFontBuildDstData *)&pIVar77->GlyphsHighest) {
      uVar74 = pIVar77->SrcCount;
      if (uVar74 != 0) {
        for (uVar75 = 0; uVar75 != 0x20; uVar75 = uVar75 + 1) {
          if ((uVar74 >> (uVar75 & 0x1f) & 1) != 0) {
            x0 = iVar50 + uVar75;
            ImVector<int>::push_back(&pIVar43->GlyphsList,&x0);
          }
        }
      }
      iVar50 = iVar50 + 0x20;
    }
    ImVector<unsigned_int>::clear(&pIVar90[lVar64].GlyphsSet.Storage);
    uVar89 = src_tmp_array._0_8_ & 0xffffffff;
  }
  lVar64 = 0x10;
  for (lVar62 = 0; lVar62 < dst_tmp_array.Size; lVar62 = lVar62 + 1) {
    ImVector<unsigned_int>::clear
              ((ImVector<unsigned_int> *)((long)&(dst_tmp_array.Data)->SrcCount + lVar64));
    lVar64 = lVar64 + 0x20;
  }
  ImVector<ImFontBuildDstData>::clear(&dst_tmp_array);
  buf_rects = (ImVector<stbrp_rect>)ZEXT816(0);
  buf_packedchars.Size = 0;
  buf_packedchars.Capacity = 0;
  buf_packedchars.Data = (stbtt_packedchar *)0x0;
  ImVector<stbrp_rect>::resize(&buf_rects,local_448._0_4_);
  ImVector<stbtt_packedchar>::resize(&buf_packedchars,local_448._0_4_);
  uVar89 = 0;
  memset(buf_rects.Data,0,(long)buf_rects.Size << 4);
  memset(buf_packedchars.Data,0,(long)buf_packedchars.Size * 0x1c);
  iVar52 = 0;
  iVar50 = 0;
  local_448._0_4_ = 0;
  while( true ) {
    uVar107 = 0x80000000;
    uVar106 = 0x80000000;
    uVar105 = 0x80000000;
    if ((long)src_tmp_array.Size <= (long)uVar89) break;
    iVar88 = src_tmp_array.Data[uVar89].GlyphsCount;
    uVar78 = uVar89;
    if (iVar88 != 0) {
      pIVar90 = src_tmp_array.Data + uVar89;
      pIVar90->Rects = buf_rects.Data + iVar50;
      pIVar90->PackedChars = buf_packedchars.Data + iVar52;
      pIVar85 = (pIVar91->ConfigData).Data;
      fVar96 = pIVar85[uVar89].SizePixels;
      (pIVar90->PackRange).font_size = fVar96;
      (pIVar90->PackRange).first_unicode_codepoint_in_range = 0;
      (pIVar90->PackRange).array_of_unicode_codepoints = (pIVar90->GlyphsList).Data;
      iVar51 = (pIVar90->GlyphsList).Size;
      (pIVar90->PackRange).num_chars = iVar51;
      (pIVar90->PackRange).chardata_for_range = buf_packedchars.Data + iVar52;
      (pIVar90->PackRange).h_oversample = (uchar)pIVar85[uVar89].OversampleH;
      (pIVar90->PackRange).v_oversample = (uchar)pIVar85[uVar89].OversampleV;
      local_490 = uVar89;
      if (fVar96 <= 0.0) {
        uVar60 = *(ushort *)((pIVar90->FontInfo).data + (long)(pIVar90->FontInfo).head + 0x12);
        fVar96 = -fVar96 / (float)(ushort)(uVar60 << 8 | uVar60 >> 8);
      }
      else {
        fVar96 = stbtt_ScaleForPixelHeight(&pIVar90->FontInfo,fVar96);
        uVar105 = extraout_XMM0_Db;
        uVar106 = extraout_XMM0_Dc;
        uVar107 = extraout_XMM0_Dd;
      }
      local_488 = (ImFontBuildDstData *)CONCAT44(uVar105,fVar96);
      iVar50 = iVar50 + iVar88;
      iVar52 = iVar52 + iVar88;
      iVar88 = pIVar91->TexGlyphPadding;
      lVar64 = 6;
      uStack_480 = uVar106;
      uStack_47c = uVar107;
      for (lVar62 = 0; pIVar91 = local_478, uVar78 = local_490, lVar62 < iVar51; lVar62 = lVar62 + 1
          ) {
        iVar51 = stbtt_FindGlyphIndex(&pIVar90->FontInfo,(pIVar90->GlyphsList).Data[lVar62]);
        stbtt_GetGlyphBitmapBoxSubpixel
                  (&pIVar90->FontInfo,iVar51,(float)pIVar85[uVar89].OversampleH * (float)local_488,
                   (float)pIVar85[uVar89].OversampleV * (float)local_488,(float)local_488,in_XMM3_Da
                   ,&x0,(int *)&charstrings,(int *)&fdarrayoff,&y1);
        uVar74 = (pIVar85[uVar89].OversampleH + ((fdarrayoff + iVar88) - x0)) - 1;
        psVar94 = pIVar90->Rects;
        *(short *)((long)psVar94 + lVar64 + -2) = (short)uVar74;
        uVar75 = (pIVar85[uVar89].OversampleV + ((y1 + iVar88) - charstrings)) - 1;
        *(short *)((long)&psVar94->id + lVar64) = (short)uVar75;
        local_448._0_4_ = local_448._0_4_ + (uVar75 & 0xffff) * (uVar74 & 0xffff);
        iVar51 = (pIVar90->GlyphsList).Size;
        lVar64 = lVar64 + 0x10;
      }
    }
    uVar89 = uVar78 + 1;
  }
  pIVar91->TexHeight = 0;
  local_498 = pIVar91->TexDesiredWidth;
  if (local_498 < 1) {
    iVar50 = (int)SQRT((float)(int)local_448._0_4_);
    local_498 = 0x1000;
    if ((iVar50 < 0xb33) && (local_498 = 0x800, iVar50 < 0x599)) {
      local_498 = (uint)(0x2cb < iVar50) * 0x200 + 0x200;
    }
  }
  pIVar91->TexWidth = local_498;
  local_49c = pIVar91->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar50 = local_498 - local_49c;
  ptr_00 = (stbrp_node *)ImGui::MemAlloc((long)iVar50 << 4);
  if ((ptr == (stbrp_context *)0x0) || (ptr_00 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (ptr_00 != (stbrp_node *)0x0) {
      ImGui::MemFree(ptr_00);
    }
    ptr_00 = (stbrp_node *)0x0;
    local_49c = 0;
    local_498 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    uVar74 = iVar50 - 1;
    uVar78 = 0;
    psVar23 = ptr_00;
    uVar89 = uVar78;
    if (0 < (int)uVar74) {
      uVar78 = (ulong)uVar74;
      uVar89 = uVar78;
    }
    while( true ) {
      bVar95 = uVar78 == 0;
      uVar78 = uVar78 - 1;
      if (bVar95) break;
      psVar23->next = psVar23 + 1;
      psVar23 = psVar23 + 1;
    }
    ptr_00[uVar89].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = ptr_00;
    ptr->active_head = ptr->extra;
    ptr->width = iVar50;
    ptr->height = 0x8000 - local_49c;
    ptr->num_nodes = iVar50;
    ptr->align = (int)(uVar74 + iVar50) / iVar50;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar50;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_358 = ptr;
  ImFontAtlasBuildPackCustomRects(pIVar91,ptr);
  for (lVar64 = 0; pIVar90 = src_tmp_array.Data, lVar64 < src_tmp_array.Size; lVar64 = lVar64 + 1) {
    if (src_tmp_array.Data[lVar64].GlyphsCount != 0) {
      stbrp_pack_rects(local_358,src_tmp_array.Data[lVar64].Rects,
                       src_tmp_array.Data[lVar64].GlyphsCount);
      uVar74 = pIVar90[lVar64].GlyphsCount;
      if ((int)uVar74 < 1) {
        uVar74 = 0;
      }
      for (lVar62 = 0; (ulong)uVar74 * 0x10 != lVar62; lVar62 = lVar62 + 0x10) {
        psVar94 = pIVar90[lVar64].Rects;
        if (*(int *)((long)&psVar94->was_packed + lVar62) != 0) {
          iVar50 = (uint)*(ushort *)((long)&psVar94->h + lVar62) +
                   (uint)*(ushort *)((long)&psVar94->y + lVar62);
          if (iVar50 < pIVar91->TexHeight) {
            iVar50 = pIVar91->TexHeight;
          }
          pIVar91->TexHeight = iVar50;
        }
      }
    }
  }
  uVar74 = pIVar91->TexHeight;
  if ((pIVar91->Flags & 1) == 0) {
    uVar74 = (int)(uVar74 - 1) >> 1 | uVar74 - 1;
    uVar74 = (int)uVar74 >> 2 | uVar74;
    uVar74 = (int)uVar74 >> 4 | uVar74;
    uVar74 = (int)uVar74 >> 8 | uVar74;
    uVar74 = (int)uVar74 >> 0x10 | uVar74;
  }
  iVar50 = uVar74 + 1;
  pIVar91->TexHeight = iVar50;
  auVar98._0_4_ = (float)pIVar91->TexWidth;
  auVar98._4_4_ = (float)iVar50;
  auVar98._8_8_ = 0;
  auVar110 = divps(_DAT_0015d090,auVar98);
  pIVar91->TexUvScale = auVar110._0_8_;
  puVar55 = (uchar *)ImGui::MemAlloc((long)(iVar50 * pIVar91->TexWidth));
  pIVar91->TexPixelsAlpha8 = puVar55;
  lVar64 = 0;
  memset(puVar55,0,(long)pIVar91->TexHeight * (long)pIVar91->TexWidth);
  puVar55 = pIVar91->TexPixelsAlpha8;
  lVar62 = (long)local_498;
  local_278 = pshuflw(ZEXT416(local_49c),ZEXT416(local_49c),0);
  local_2e8 = puVar55 + 1;
  auVar110 = ZEXT816(0);
  local_348 = ptr_00;
  while (lVar64 < src_tmp_array.Size) {
    local_350 = lVar64;
    if (src_tmp_array.Data[lVar64].GlyphsCount != 0) {
      local_2f8 = (local_478->ConfigData).Data;
      pIVar90 = src_tmp_array.Data + lVar64;
      psVar94 = pIVar90->Rects;
      bVar95 = true;
      lVar64 = 0;
      local_2e0 = psVar94;
      while( true ) {
        uVar107 = 0x80000000;
        uVar106 = 0x80000000;
        uVar105 = 0x80000000;
        if (!bVar95) break;
        fVar96 = (pIVar90->PackRange).font_size;
        if (fVar96 <= 0.0) {
          uVar60 = *(ushort *)((pIVar90->FontInfo).data + (long)(pIVar90->FontInfo).head + 0x12);
          local_248 = -fVar96 / (float)(ushort)(uVar60 << 8 | uVar60 >> 8);
        }
        else {
          local_248 = stbtt_ScaleForPixelHeight(&pIVar90->FontInfo,fVar96);
          auVar110 = ZEXT816(0);
          uVar105 = extraout_var_00._0_4_;
          uVar106 = extraout_var_00._4_4_;
          uVar107 = extraout_var_00._8_4_;
        }
        uVar89._0_1_ = (pIVar90->PackRange).h_oversample;
        uVar20 = (pIVar90->PackRange).v_oversample;
        uVar21 = *(undefined6 *)&(pIVar90->PackRange).field_0x22;
        uVar89._1_7_ = CONCAT61(uVar21,uVar20);
        auVar35._8_6_ = 0;
        auVar35._0_8_ = uVar89;
        auVar35[0xe] = (char)((uint6)uVar21 >> 0x28);
        auVar37._8_4_ = 0;
        auVar37._0_8_ = uVar89;
        auVar37[0xc] = (char)((uint6)uVar21 >> 0x20);
        auVar37._13_2_ = auVar35._13_2_;
        auVar38._8_4_ = 0;
        auVar38._0_8_ = uVar89;
        auVar38._12_3_ = auVar37._12_3_;
        auVar39._8_2_ = 0;
        auVar39._0_8_ = uVar89;
        auVar39[10] = (char)((uint6)uVar21 >> 0x18);
        auVar39._11_4_ = auVar38._11_4_;
        auVar40._8_2_ = 0;
        auVar40._0_8_ = uVar89;
        auVar40._10_5_ = auVar39._10_5_;
        auVar41[8] = (char)((uint6)uVar21 >> 0x10);
        auVar41._0_8_ = uVar89;
        auVar41._9_6_ = auVar40._9_6_;
        cVar104 = (char)((uint6)uVar21 >> 8);
        Var29 = CONCAT91((unkuint9)auVar41._8_7_ << 8,cVar104);
        auVar34[10] = 0;
        auVar34._0_10_ = Var29;
        cVar103 = (char)uVar21;
        auVar100._0_4_ = (uint)uVar89;
        auVar100[4] = cVar103;
        auVar100._5_11_ = auVar34 << 8;
        auVar33[0xc] = 0;
        auVar33._0_12_ = auVar100._4_12_;
        auVar28._1_13_ = auVar33 << 8;
        auVar28[0] = uVar20;
        auVar99._0_2_ = CONCAT11(0,(undefined1)uVar89);
        auVar99._2_14_ = auVar28;
        local_448._0_2_ = auVar28._0_2_;
        sVar24 = -auVar100._4_2_;
        uVar60 = (ushort)Var29;
        sVar25 = -uVar60;
        auVar36._10_2_ = 0;
        auVar36._0_10_ = auVar99._0_10_;
        auVar36._12_2_ = uVar60;
        uVar42 = CONCAT42(auVar36._10_4_,auVar100._4_2_);
        auVar30._2_10_ = (unkuint10)uVar42 << 0x10;
        auVar30._0_2_ = local_448._0_2_;
        auVar101._0_4_ = (float)auVar99._0_2_;
        auVar101._4_4_ = (float)auVar30._0_4_;
        auVar101._8_4_ = (float)(int)uVar42;
        auVar101._12_4_ = (float)uVar60;
        local_268 = divps(_DAT_0015d090,auVar101);
        auVar117[0] = -((undefined1)uVar89 == 0);
        auVar117[1] = -((undefined1)uVar89 == 0);
        auVar117[2] = -((undefined1)uVar89 == 0);
        auVar117[3] = -((undefined1)uVar89 == 0);
        auVar117[4] = -(uVar20 == '\0');
        auVar117[5] = -(uVar20 == '\0');
        auVar117[6] = -(uVar20 == '\0');
        auVar117[7] = -(uVar20 == '\0');
        auVar117[8] = -(cVar103 == auVar110[8]);
        auVar117[9] = -(cVar103 == auVar110[9]);
        auVar117[10] = -(cVar103 == auVar110[10]);
        auVar117[0xb] = -(cVar103 == auVar110[0xb]);
        auVar117[0xc] = -(cVar104 == auVar110[0xc]);
        auVar117[0xd] = -(cVar104 == auVar110[0xd]);
        auVar117[0xe] = -(cVar104 == auVar110[0xe]);
        auVar117[0xf] = -(cVar104 == auVar110[0xf]);
        Var32 = CONCAT64(CONCAT42(CONCAT22(sVar25,sVar25),sVar24),CONCAT22(sVar24,sVar25));
        auVar31._4_8_ = (long)((unkuint10)Var32 >> 0x10);
        auVar31._2_2_ = 1 - local_448._0_2_;
        auVar31._0_2_ = 1 - local_448._0_2_;
        auVar111._0_4_ = (float)(int)(short)(1 - auVar99._0_2_);
        auVar111._4_4_ = (float)(auVar31._0_4_ >> 0x10);
        auVar111._8_4_ = (float)((int)((unkuint10)Var32 >> 0x10) >> 0x10);
        auVar111._12_4_ = (float)(int)sVar25;
        fVar96 = local_248 * auVar101._0_4_;
        local_2a8 = local_248 * auVar101._4_4_;
        fStack_290 = local_248 * auVar101._8_4_;
        fStack_28c = local_248 * auVar101._12_4_;
        auVar102._0_4_ = auVar101._0_4_ + auVar101._0_4_;
        auVar102._4_4_ = auVar101._4_4_ + auVar101._4_4_;
        auVar102._8_4_ = auVar101._8_4_ + auVar101._8_4_;
        auVar102._12_4_ = auVar101._12_4_ + auVar101._12_4_;
        local_258 = divps(auVar111,auVar102);
        local_258 = ~auVar117 & local_258;
        lVar64 = (long)(int)lVar64;
        fVar108 = local_2a8;
        if (fVar96 <= local_2a8) {
          fVar108 = fVar96;
        }
        fVar108 = (0.35 / fVar108) * (0.35 / fVar108);
        fStack_284 = -local_2a8;
        local_310 = uVar89 & 0xff;
        local_318 = (ulong)((uint)uVar89._1_7_ & 0xff);
        local_488 = (ImFontBuildDstData *)(ulong)(auVar100._0_4_ & 0xff);
        lVar58 = 0;
        fStack_2a4 = local_2a8;
        fStack_2a0 = local_2a8;
        fStack_29c = local_2a8;
        local_298 = fVar96;
        fStack_294 = local_2a8;
        local_288 = fVar96;
        fStack_280 = fVar96;
        fStack_27c = fStack_284;
        uStack_244 = uVar105;
        uStack_240 = uVar106;
        uStack_23c = uVar107;
LAB_00133e85:
        if (lVar58 < (pIVar90->PackRange).num_chars) {
          if (psVar94[lVar64].was_packed != 0) {
            sVar11 = psVar94[lVar64].w;
            if ((sVar11 == 0) || (sVar12 = psVar94[lVar64].h, sVar12 == 0)) goto LAB_001353f2;
            piVar73 = (pIVar90->PackRange).array_of_unicode_codepoints;
            if (piVar73 == (int *)0x0) {
              iVar50 = (pIVar90->PackRange).first_unicode_codepoint_in_range + (int)lVar58;
            }
            else {
              iVar50 = piVar73[lVar58];
            }
            local_338 = (pIVar90->PackRange).chardata_for_range + lVar58;
            local_330 = lVar58;
            local_328 = lVar64;
            iVar52 = stbtt_FindGlyphIndex(&pIVar90->FontInfo,iVar50);
            fVar97 = auVar110._0_4_;
            uVar15 = psVar94[lVar64].x;
            uVar16 = psVar94[lVar64].y;
            psVar94[lVar64].x = uVar15 + local_278._0_2_;
            psVar94[lVar64].y = uVar16 + local_278._2_2_;
            psVar94[lVar64].w = sVar11 - (short)local_49c;
            psVar94[lVar64].h = sVar12 - (short)local_49c;
            puVar71 = (pIVar90->FontInfo).data;
            uVar60 = *(ushort *)(puVar71 + (long)(pIVar90->FontInfo).hhea + 0x22) << 8 |
                     *(ushort *)(puVar71 + (long)(pIVar90->FontInfo).hhea + 0x22) >> 8;
            iVar50 = (pIVar90->FontInfo).hmtx;
            lVar58 = (ulong)uVar60 * 4 + (long)iVar50 + -4;
            lVar80 = (ulong)uVar60 * 4 + (long)iVar50 + -3;
            if (iVar52 < (int)(uint)uVar60) {
              lVar58 = (long)(iVar52 * 4) + (long)iVar50;
              lVar80 = (long)(iVar52 * 4) + 1 + (long)iVar50;
            }
            uVar7 = puVar71[lVar58];
            uVar8 = puVar71[lVar80];
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar90->FontInfo,iVar52,local_298,local_2a8,fVar96,fVar97,&x0_1,&y0_1,&x1_1
                       ,&local_2b0);
            uVar60 = psVar94[lVar64].x;
            uVar61 = psVar94[lVar64].y;
            uVar13 = psVar94[lVar64].w;
            uVar14 = psVar94[lVar64].h;
            uVar74 = stbtt_GetGlyphShape(&pIVar90->FontInfo,iVar52,(stbtt_vertex **)&fdarrayoff);
            uVar75 = ((uint)uVar13 - (int)local_488) + 1;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar90->FontInfo,iVar52,local_298,local_2a8,fVar96,fVar97,&y1,&iy0,
                       (int *)0x0,(int *)0x0);
            iVar50 = y1;
            if (uVar75 != 0) {
              uVar53 = ((uint)uVar14 - (uint)(ushort)local_448._0_2_) + 1;
              if (uVar53 != 0) {
                iVar52 = (uint)uVar13 - (int)(float)local_488;
                lVar58 = CONCAT44(uStack_424,fdarrayoff);
                local_340 = (ulong)(uint)iy0;
                uVar78 = 0;
                uVar89 = (ulong)uVar74;
                if ((int)uVar74 < 1) {
                  uVar89 = uVar78;
                }
                uVar65 = 0;
                for (; uVar89 * 0xe - uVar78 != 0; uVar78 = uVar78 + 0xe) {
                  uVar65 = (ulong)((int)uVar65 + (uint)(*(char *)(lVar58 + 0xc + uVar78) == '\x01'))
                  ;
                }
                if (((int)uVar65 != 0) &&
                   (local_490 = uVar65, ptr_01 = ImGui::MemAlloc(uVar65 * 4), ptr_01 != (void *)0x0)
                   ) {
                  local_430 = (stbtt__point *)0x0;
                  iVar88 = 0;
                  iVar68 = 0;
                  iVar51 = 0;
                  do {
                    if (iVar68 == 1) {
                      local_430 = (stbtt__point *)ImGui::MemAlloc((long)iVar51 << 3);
                      if (local_430 == (stbtt__point *)0x0) {
                        ImGui::MemFree((void *)0x0);
                        ImGui::MemFree(ptr_01);
                        break;
                      }
                    }
                    else if (iVar68 == 2) goto LAB_00134325;
                    x0 = 0;
                    fVar96 = 0.0;
                    fVar97 = 0.0;
                    uVar74 = 0xffffffff;
                    for (lVar80 = 0; uVar89 * 0xe - lVar80 != 0; lVar80 = lVar80 + 0xe) {
                      iVar51 = x0;
                      switch(*(undefined1 *)(lVar58 + 0xc + lVar80)) {
                      case 1:
                        if (-1 < (int)uVar74) {
                          *(int *)((long)ptr_01 + (ulong)uVar74 * 4) = x0 - iVar88;
                        }
                        uVar74 = uVar74 + 1;
                        auVar110 = pshuflw(ZEXT416(*(uint *)(lVar58 + lVar80)),
                                           ZEXT416(*(uint *)(lVar58 + lVar80)),0x60);
                        fVar96 = (float)(auVar110._0_4_ >> 0x10);
                        fVar97 = (float)(auVar110._4_4_ >> 0x10);
                        iVar88 = x0;
                        iVar51 = x0 + 1;
                        if (local_430 != (stbtt__point *)0x0) {
                          local_430[x0].x = fVar96;
                          local_430[x0].y = fVar97;
                        }
                        break;
                      case 2:
                        auVar110 = pshuflw(ZEXT416(*(uint *)(lVar58 + lVar80)),
                                           ZEXT416(*(uint *)(lVar58 + lVar80)),0x60);
                        fVar96 = (float)(auVar110._0_4_ >> 0x10);
                        fVar97 = (float)(auVar110._4_4_ >> 0x10);
                        iVar51 = x0 + 1;
                        if (local_430 != (stbtt__point *)0x0) {
                          local_430[x0].x = fVar96;
                          local_430[x0].y = fVar97;
                        }
                        break;
                      case 3:
                        stbtt__tesselate_curve
                                  (local_430,&x0,fVar96,fVar97,
                                   (float)(int)*(short *)(lVar58 + 4 + lVar80),
                                   (float)(int)*(short *)(lVar58 + 6 + lVar80),
                                   (float)(int)*(short *)(lVar58 + lVar80),
                                   (float)(int)*(short *)(lVar58 + 2 + lVar80),fVar108,0);
                        goto LAB_001342a7;
                      case 4:
                        stbtt__tesselate_cubic
                                  (local_430,&x0,fVar96,fVar97,
                                   (float)(int)*(short *)(lVar58 + 4 + lVar80),
                                   (float)(int)*(short *)(lVar58 + 6 + lVar80),
                                   (float)(int)*(short *)(lVar58 + 8 + lVar80),
                                   (float)(int)*(short *)(lVar58 + 10 + lVar80),
                                   (float)(int)*(short *)(lVar58 + lVar80),
                                   (float)(int)*(short *)(lVar58 + 2 + lVar80),fVar108,0);
LAB_001342a7:
                        auVar110 = pshuflw(ZEXT416(*(uint *)(lVar58 + lVar80)),
                                           ZEXT416(*(uint *)(lVar58 + lVar80)),0x60);
                        fVar96 = (float)(auVar110._0_4_ >> 0x10);
                        fVar97 = (float)(auVar110._4_4_ >> 0x10);
                        iVar51 = x0;
                      }
                      x0 = iVar51;
                    }
                    *(int *)((long)ptr_01 + (long)(int)uVar74 * 4) = x0 - iVar88;
                    iVar68 = iVar68 + 1;
                    iVar51 = x0;
                  } while( true );
                }
              }
            }
            goto LAB_00134e4f;
          }
          goto LAB_001353f2;
        }
        bVar95 = false;
      }
      fVar96 = local_2f8[local_350].RasterizerMultiply;
      if ((fVar96 != 1.0) || (NAN(fVar96))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)&x0,fVar96);
        piVar73 = &pIVar90->Rects->was_packed;
        for (iVar50 = 0; iVar50 < pIVar90->GlyphsCount; iVar50 = iVar50 + 1) {
          if (*piVar73 != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)&x0,local_478->TexPixelsAlpha8,(uint)*(ushort *)(piVar73 + -1),
                       (uint)*(stbrp_coord *)((long)piVar73 + -2),(uint)*(ushort *)(piVar73 + -2),
                       (uint)*(stbrp_coord *)((long)piVar73 + -6),local_478->TexWidth);
          }
          piVar73 = piVar73 + 4;
        }
        auVar110 = ZEXT816(0);
      }
      pIVar90->Rects = (stbrp_rect *)0x0;
    }
    lVar64 = local_350 + 1;
  }
  ImGui::MemFree(ptr_00);
  ImGui::MemFree(local_358);
  ImVector<stbrp_rect>::clear(&buf_rects);
  lVar64 = 0;
  while( true ) {
    pIVar91 = local_478;
    uVar89 = (ulong)src_tmp_array.Size;
    if ((long)uVar89 <= lVar64) break;
    if (src_tmp_array.Data[lVar64].GlyphsCount != 0) {
      pIVar90 = src_tmp_array.Data + lVar64;
      pIVar85 = (local_478->ConfigData).Data;
      font = pIVar85[lVar64].DstFont;
      fVar96 = stbtt_ScaleForPixelHeight(&pIVar90->FontInfo,pIVar85[lVar64].SizePixels);
      puVar55 = (pIVar90->FontInfo).data;
      lVar62 = (long)(pIVar90->FontInfo).hhea;
      uVar60 = *(ushort *)(puVar55 + lVar62 + 4);
      uVar60 = uVar60 << 8 | uVar60 >> 8;
      fVar108 = -1.0;
      if (0 < (short)uVar60) {
        fVar108 = 1.0;
      }
      uVar61 = *(ushort *)(puVar55 + lVar62 + 6);
      uVar61 = uVar61 << 8 | uVar61 >> 8;
      fVar97 = -1.0;
      if (0 < (short)uVar61) {
        fVar97 = 1.0;
      }
      pIVar85 = pIVar85 + lVar64;
      ImFontAtlasBuildSetupFont
                (local_478,font,pIVar85,(float)(int)((float)(int)(short)uVar60 * fVar96 + fVar108),
                 (float)(int)((float)(int)(short)uVar61 * fVar96 + fVar97));
      local_488 = (ImFontBuildDstData *)CONCAT44(local_488._4_4_,(pIVar85->GlyphOffset).x);
      fVar96 = (float)(int)(font->Ascent + 0.5) + (pIVar85->GlyphOffset).y;
      lVar58 = 0;
      for (lVar62 = 0; lVar62 < pIVar90->GlyphsCount; lVar62 = lVar62 + 1) {
        psVar19 = pIVar90->PackedChars;
        fVar97 = 1.0 / (float)local_478->TexHeight;
        fVar108 = 1.0 / (float)local_478->TexWidth;
        ImFont::AddGlyph(font,pIVar85,*(ImWchar *)((pIVar90->GlyphsList).Data + lVar62),
                         *(float *)((long)&psVar19->xoff + lVar58) + 0.0 + (float)local_488,
                         *(float *)((long)&psVar19->yoff + lVar58) + 0.0 + fVar96,
                         *(float *)((long)&psVar19->xoff2 + lVar58) + 0.0 + (float)local_488,
                         *(float *)((long)&psVar19->yoff2 + lVar58) + 0.0 + fVar96,
                         (float)*(ushort *)((long)&psVar19->x0 + lVar58) * fVar108,
                         (float)*(ushort *)((long)&psVar19->y0 + lVar58) * fVar97,
                         (float)*(ushort *)((long)&psVar19->x1 + lVar58) * fVar108,
                         (float)*(ushort *)((long)&psVar19->y1 + lVar58) * fVar97,
                         *(float *)((long)&psVar19->xadvance + lVar58));
        lVar58 = lVar58 + 0x1c;
      }
    }
    lVar64 = lVar64 + 1;
  }
  lVar64 = 0;
  for (lVar62 = 0; lVar62 < (int)uVar89; lVar62 = lVar62 + 1) {
    ImFontBuildSrcData::~ImFontBuildSrcData
              ((ImFontBuildSrcData *)((long)&((src_tmp_array.Data)->FontInfo).userdata + lVar64));
    uVar89 = src_tmp_array._0_8_ & 0xffffffff;
    lVar64 = lVar64 + 0x110;
  }
  ImFontAtlasBuildFinish(pIVar91);
  ImVector<stbtt_packedchar>::~ImVector(&buf_packedchars);
  ImVector<stbrp_rect>::~ImVector(&buf_rects);
LAB_0013573d:
  bVar95 = local_2f0 <= lVar69;
  ImVector<ImFontBuildDstData>::~ImVector(&dst_tmp_array);
  ImVector<ImFontBuildSrcData>::~ImVector(&src_tmp_array);
  return bVar95;
LAB_00134325:
  if (local_430 != (stbtt__point *)0x0) {
    iVar88 = 0;
    for (uVar89 = 0; local_490 != uVar89; uVar89 = uVar89 + 1) {
      iVar88 = iVar88 + *(int *)((long)ptr_01 + uVar89 * 4);
    }
    p_00 = (stbtt__edge *)ImGui::MemAlloc((long)(iVar88 + 1) * 0x14);
    if (p_00 != (stbtt__edge *)0x0) {
      iVar88 = 0;
      iVar51 = 0;
      for (uVar89 = 0; uVar89 != local_490; uVar89 = uVar89 + 1) {
        iVar68 = *(int *)((long)ptr_01 + uVar89 * 4);
        uVar65 = (ulong)(iVar68 - 1);
        iVar87 = iVar68;
        for (uVar78 = 0; iVar86 = (int)uVar65, (long)uVar78 < (long)iVar87; uVar78 = uVar78 + 1) {
          fVar96 = local_430[(long)iVar88 + (long)iVar86].y;
          fVar97 = local_430[(long)iVar88 + uVar78].y;
          if ((fVar96 != fVar97) || (NAN(fVar96) || NAN(fVar97))) {
            iVar87 = (int)uVar78;
            if (fVar96 <= fVar97) {
              iVar87 = iVar86;
              iVar86 = (int)uVar78;
            }
            p_00[iVar51].invert = (uint)(fVar97 < fVar96);
            sVar3 = local_430[(long)iVar88 + (long)iVar86];
            sVar4 = local_430[(long)iVar88 + (long)iVar87];
            psVar93 = p_00 + iVar51;
            psVar93->x0 = sVar3.x * local_288 + 0.0;
            psVar93->y0 = sVar3.y * fStack_284 + 0.0;
            psVar93->x1 = sVar4.x * fStack_280 + 0.0;
            psVar93->y1 = sVar4.y * fStack_27c + 0.0;
            iVar51 = iVar51 + 1;
            iVar87 = *(int *)((long)ptr_01 + uVar89 * 4);
          }
          uVar65 = uVar78 & 0xffffffff;
        }
        iVar88 = iVar68 + iVar88;
      }
      stbtt__sort_edges_quicksort(p_00,iVar51);
      psVar93 = p_00;
      for (uVar89 = 1; (long)uVar89 < (long)iVar51; uVar89 = uVar89 + 1) {
        uVar2 = p_00[uVar89].x0;
        uVar5 = p_00[uVar89].y0;
        uStack_230 = p_00[uVar89].invert;
        uVar17 = p_00[uVar89].x1;
        uVar22 = p_00[uVar89].y1;
        psVar79 = psVar93;
        for (uVar78 = uVar89; 0 < (long)uVar78; uVar78 = uVar78 - 1) {
          if (psVar79->y0 <= (float)uVar5) goto LAB_001344d5;
          psVar79[1].invert = psVar79->invert;
          fVar96 = psVar79->y0;
          fVar97 = psVar79->x1;
          fVar120 = psVar79->y1;
          psVar79[1].x0 = psVar79->x0;
          psVar79[1].y0 = fVar96;
          psVar79[1].x1 = fVar97;
          psVar79[1].y1 = fVar120;
          psVar79 = psVar79 + -1;
        }
        uVar78 = 0;
LAB_001344d5:
        iVar88 = (int)uVar78;
        if (uVar89 != (uVar78 & 0xffffffff)) {
          p_00[iVar88].x0 = (float)uVar2;
          p_00[iVar88].y0 = (float)uVar5;
          p_00[iVar88].x1 = (float)uVar17;
          p_00[iVar88].y1 = (float)uVar22;
          p_00[iVar88].invert = uStack_230;
        }
        psVar93 = psVar93 + 1;
        x0 = uVar17;
        uStack_234 = uVar22;
      }
      _charstrings = (stbtt__active_edge *)0x0;
      scanline_00 = (float *)&x0;
      if (0x3f < iVar52) {
        scanline_00 = (float *)ImGui::MemAlloc((ulong)uVar75 * 8 + 4);
      }
      local_2d0 = (long)(int)uVar75;
      scanline = scanline_00 + local_2d0;
      p_00[iVar51].y0 = (float)(int)((int)local_340 + uVar53) + 1.0;
      local_2c0 = local_2d0 * 4;
      local_2c8 = (long)iVar52 * 4 + 8;
      local_41c = (float)(int)uVar75;
      uVar89 = 0;
      if ((int)uVar75 < 1) {
        uVar75 = 0;
      }
      local_2d8 = 0;
      if (0 < local_2d0) {
        local_2d8 = local_2d0;
      }
      uVar78 = (ulong)uVar53;
      if ((int)uVar53 < 1) {
        uVar78 = uVar89;
      }
      psVar57 = (stbtt__active_edge *)0x0;
      local_420 = 0;
      local_3b0 = (undefined8 *)0x0;
      uVar65 = local_340 & 0xffffffff;
      local_320 = p_00;
      for (iVar52 = 0; local_380 = (int)uVar78, iVar52 != local_380; iVar52 = iVar52 + 1) {
        fVar96 = (float)(int)uVar65;
        memset(scanline_00,0,local_2c0);
        memset(scanline,0,local_2c8);
        psVar76 = (stbtt__active_edge *)&charstrings;
        while (psVar66 = psVar76, psVar70 = psVar66->next, psVar70 != (stbtt__active_edge *)0x0) {
          psVar76 = psVar70;
          if (psVar70->ey <= fVar96) {
            psVar66->next = psVar70->next;
            psVar70->direction = 0.0;
            psVar70->next = psVar57;
            psVar76 = psVar66;
            psVar57 = psVar70;
          }
        }
        local_2b8 = uVar89;
        bVar95 = (int)local_340 != 0;
        fVar97 = fVar96 + 1.0;
        for (psVar93 = local_320; fVar120 = psVar93->y0, fVar120 <= fVar97; psVar93 = psVar93 + 1) {
          fVar112 = psVar93->y1;
          if ((fVar120 != fVar112) || (NAN(fVar120) || NAN(fVar112))) {
            if (psVar57 == (stbtt__active_edge *)0x0) {
              if (local_420 == 0) {
                puVar56 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar56 == (undefined8 *)0x0) {
                  psVar57 = (stbtt__active_edge *)0x0;
                  local_420 = 0;
                  goto LAB_00134822;
                }
                *puVar56 = local_3b0;
                fVar120 = psVar93->y0;
                fVar112 = psVar93->y1;
                local_420 = 799;
              }
              else {
                local_420 = local_420 + -1;
                puVar56 = local_3b0;
              }
              psVar70 = (stbtt__active_edge *)(puVar56 + (long)local_420 * 4 + 1);
              psVar76 = (stbtt__active_edge *)0x0;
              local_3b0 = puVar56;
            }
            else {
              psVar76 = psVar57->next;
              psVar70 = psVar57;
            }
            psVar57 = psVar76;
            fVar109 = psVar93->x0;
            fVar113 = (psVar93->x1 - fVar109) / (fVar112 - fVar120);
            psVar70->fdx = fVar113;
            psVar70->fdy = (float)(-(uint)(fVar113 != 0.0) & (uint)(1.0 / fVar113));
            psVar70->fx = ((fVar96 - fVar120) * fVar113 + fVar109) - (float)iVar50;
            psVar70->direction = *(float *)(&DAT_00166914 + (ulong)(psVar93->invert == 0) * 4);
            psVar70->sy = fVar120;
            psVar70->ey = fVar112;
            psVar70->next = (stbtt__active_edge *)0x0;
            if (fVar112 < fVar96 && (iVar52 == 0 && bVar95)) {
              psVar70->ey = fVar96;
            }
            psVar70->next = _charstrings;
            _charstrings = psVar70;
          }
LAB_00134822:
        }
        local_320 = psVar93;
        psVar76 = _charstrings;
        if (_charstrings != (stbtt__active_edge *)0x0) {
          for (; psVar76 != (stbtt__active_edge *)0x0; psVar76 = psVar76->next) {
            fVar120 = psVar76->fx;
            fVar112 = psVar76->fdx;
            if ((fVar112 != 0.0) || (NAN(fVar112))) {
              fVar119 = fVar112 + fVar120;
              fVar109 = psVar76->sy;
              fVar113 = (float)(~-(uint)(fVar96 < fVar109) & (uint)fVar120 |
                               (uint)((fVar109 - fVar96) * fVar112 + fVar120) &
                               -(uint)(fVar96 < fVar109));
              if (0.0 <= fVar113) {
                fVar114 = psVar76->ey;
                fVar118 = (float)(-(uint)(fVar114 < fVar97) &
                                  (uint)((fVar114 - fVar96) * fVar112 + fVar120) |
                                 ~-(uint)(fVar114 < fVar97) & (uint)fVar119);
                if (((0.0 <= fVar118) && (fVar113 < local_41c)) && (fVar118 < local_41c)) {
                  if (fVar109 <= fVar96) {
                    fVar109 = fVar96;
                  }
                  iVar88 = (int)fVar113;
                  if (fVar97 <= fVar114) {
                    fVar114 = fVar97;
                  }
                  iVar51 = (int)fVar118;
                  if (iVar88 == iVar51) {
                    lVar58 = (long)iVar88;
                    scanline_00[lVar58] =
                         (((fVar118 - (float)iVar88) + (fVar113 - (float)iVar88)) * -0.5 + 1.0) *
                         psVar76->direction * (fVar114 - fVar109) + scanline_00[lVar58];
                    fVar120 = (fVar114 - fVar109) * psVar76->direction;
                  }
                  else {
                    fVar112 = psVar76->fdy;
                    fVar116 = fVar118;
                    iVar68 = iVar88;
                    if (fVar118 < fVar113) {
                      fVar115 = fVar96 - fVar109;
                      fVar109 = (fVar96 - fVar114) + fVar97;
                      fVar112 = -fVar112;
                      fVar116 = fVar113;
                      fVar120 = fVar119;
                      fVar114 = fVar115 + fVar97;
                      iVar68 = iVar51;
                      iVar51 = iVar88;
                      fVar113 = fVar118;
                    }
                    iVar88 = iVar68 + 1;
                    fVar118 = ((float)iVar88 - fVar120) * fVar112 + fVar96;
                    fVar120 = psVar76->direction;
                    fVar119 = (fVar118 - fVar109) * fVar120;
                    scanline_00[iVar68] =
                         (1.0 - ((fVar113 - (float)iVar68) + 1.0) * 0.5) * fVar119 +
                         scanline_00[iVar68];
                    lVar58 = (long)iVar51;
                    for (lVar80 = (long)iVar88; lVar80 < lVar58; lVar80 = lVar80 + 1) {
                      scanline_00[lVar80] = fVar112 * fVar120 * 0.5 + fVar119 + scanline_00[lVar80];
                      fVar119 = fVar119 + fVar112 * fVar120;
                    }
                    scanline_00[lVar58] =
                         (fVar114 - (fVar112 * (float)(iVar51 - iVar88) + fVar118)) *
                         (((fVar116 - (float)iVar51) + 0.0) * -0.5 + 1.0) * fVar120 + fVar119 +
                         scanline_00[lVar58];
                    fVar120 = (fVar114 - fVar109) * fVar120;
                  }
                  scanline[lVar58 + 1] = fVar120 + scanline[lVar58 + 1];
                  goto LAB_00134d47;
                }
              }
              local_308 = fVar120;
              uStack_304 = 0;
              uStack_300 = 0;
              uStack_2fc = 0;
              uVar74 = 0;
              while (uVar75 != uVar74) {
                fVar109 = (float)(int)uVar74;
                fVar113 = (float)(int)(uVar74 + 1);
                fVar120 = (fVar109 - local_308) / fVar112 + fVar96;
                fVar114 = (fVar113 - local_308) / fVar112 + fVar96;
                local_490 = CONCAT44(local_490._4_4_,fVar109);
                if ((fVar109 <= local_308) || (fVar119 <= fVar113)) {
                  if ((fVar109 <= fVar119) || (local_308 <= fVar113)) {
                    fVar118 = fVar96;
                    fVar116 = local_308;
                    if (((fVar109 <= local_308) || (fVar119 <= fVar109)) &&
                       ((fVar109 <= fVar119 || (local_308 <= fVar109)))) {
                      fVar120 = fVar96;
                      fVar109 = local_308;
                      if (((local_308 < fVar113) && (fVar113 < fVar119)) ||
                         ((fVar119 < fVar113 && (fVar113 < local_308)))) goto LAB_00134a57;
                      goto LAB_00134b11;
                    }
                  }
                  else {
                    stbtt__handle_clipped_edge
                              (scanline_00,uVar74,psVar76,local_308,fVar96,fVar113,fVar114);
                    fVar118 = fVar114;
                    fVar116 = fVar113;
                    fVar109 = (float)local_490;
                  }
                  stbtt__handle_clipped_edge
                            (scanline_00,uVar74,psVar76,fVar116,fVar118,fVar109,fVar120);
                  fVar109 = (float)local_490;
                }
                else {
                  stbtt__handle_clipped_edge
                            (scanline_00,uVar74,psVar76,local_308,fVar96,fVar109,fVar120);
                  fVar109 = (float)local_490;
LAB_00134a57:
                  stbtt__handle_clipped_edge
                            (scanline_00,uVar74,psVar76,fVar109,fVar120,fVar113,fVar114);
                  fVar120 = fVar114;
                  fVar109 = fVar113;
                }
LAB_00134b11:
                stbtt__handle_clipped_edge
                          (scanline_00,uVar74,psVar76,fVar109,fVar120,fVar119,fVar97);
                uVar74 = uVar74 + 1;
              }
            }
            else if (fVar120 < local_41c) {
              if (0.0 <= fVar120) {
                uStack_304 = 0;
                uStack_300 = 0;
                uStack_2fc = 0;
                local_308 = fVar120;
                stbtt__handle_clipped_edge
                          (scanline_00,(int)fVar120,psVar76,fVar120,fVar96,fVar120,fVar97);
                iVar88 = (int)fVar120 + 1;
                fVar120 = local_308;
              }
              else {
                iVar88 = 0;
              }
              stbtt__handle_clipped_edge(scanline,iVar88,psVar76,fVar120,fVar96,fVar120,fVar97);
            }
LAB_00134d47:
          }
        }
        fVar96 = 0.0;
        uVar89 = local_2b8 & 0xffffffff;
        lVar58 = local_2d8;
        pfVar67 = scanline_00;
        while (bVar95 = lVar58 != 0, lVar58 = lVar58 + -1, bVar95) {
          fVar96 = fVar96 + pfVar67[local_2d0];
          iVar88 = (int)(ABS(*pfVar67 + fVar96) * 255.0 + 0.5);
          if (0xfe < iVar88) {
            iVar88 = 0xff;
          }
          puVar55[(long)(int)uVar89 + (ulong)uVar61 * lVar62 + (ulong)uVar60] = (uchar)iVar88;
          uVar89 = (ulong)((int)uVar89 + 1);
          pfVar67 = pfVar67 + 1;
        }
        psVar59 = &charstrings;
        while (psVar59 = *(stbtt_uint32 **)psVar59, psVar59 != (stbtt_uint32 *)0x0) {
          psVar59[2] = (stbtt_uint32)((float)psVar59[3] + (float)psVar59[2]);
        }
        uVar65 = (ulong)((int)uVar65 + 1);
        uVar89 = (ulong)(uint)((int)local_2b8 + local_498);
      }
      while (local_3b0 != (undefined8 *)0x0) {
        puVar56 = (undefined8 *)*local_3b0;
        ImGui::MemFree(local_3b0);
        local_3b0 = puVar56;
      }
      if (scanline_00 != (float *)&x0) {
        ImGui::MemFree(scanline_00);
      }
      ImGui::MemFree(p_00);
    }
    ImGui::MemFree(ptr_01);
    ImGui::MemFree(local_430);
  }
LAB_00134e4f:
  ImGui::MemFree((void *)CONCAT44(uStack_424,fdarrayoff));
  uVar75._0_2_ = psVar94[lVar64].x;
  uVar75._2_2_ = psVar94[lVar64].y;
  uVar74._0_2_ = psVar94[lVar64].w;
  uVar74._2_2_ = psVar94[lVar64].h;
  if (1 < (byte)local_310) {
    lVar58 = (long)(int)((uVar75 >> 0x10) * local_498);
    puVar71 = puVar55 + lVar58 + (ulong)(ushort)(undefined2)uVar75;
    iVar50 = (uVar74 & 0xffff) - (int)(float)local_488;
    x0 = 0;
    uStack_234 = 0;
    if (iVar50 < 0) {
      iVar50 = -1;
    }
    uVar89 = (long)iVar50 + 1;
    puVar92 = local_2e8 + lVar58 + (ulong)(ushort)(undefined2)uVar75 + (long)iVar50;
    for (uVar75 = 0; uVar78 = local_310, uVar75 != uVar74 >> 0x10; uVar75 = uVar75 + 1) {
      memset(&x0,0,local_310);
      puVar83 = puVar92;
      uVar65 = uVar89;
      switch((int)uVar78) {
      case 2:
        uVar78 = 0;
        for (uVar82 = 0; uVar89 != uVar82; uVar82 = uVar82 + 1) {
          bVar9 = puVar71[uVar82];
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)uVar82 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar82 + 2 & 7)) = bVar9;
          uVar53 = (int)uVar78 + ((uint)bVar9 - (uint)bVar10);
          uVar78 = (ulong)uVar53;
          puVar71[uVar82] = (uchar)(uVar53 >> 1);
        }
        break;
      case 3:
        uVar78 = 0;
        for (uVar82 = 0; uVar89 != uVar82; uVar82 = uVar82 + 1) {
          bVar9 = puVar71[uVar82];
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)uVar82 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar82 + 3 & 7)) = bVar9;
          uVar78 = (ulong)((int)uVar78 + ((uint)bVar9 - (uint)bVar10));
          puVar71[uVar82] = (uchar)(uVar78 / 3);
        }
        break;
      case 4:
        uVar78 = 0;
        for (uVar82 = 0; uVar89 != uVar82; uVar82 = uVar82 + 1) {
          bVar9 = puVar71[uVar82];
          uVar81 = (ulong)((uint)uVar82 & 7);
          *(byte *)((long)&x0 + (uVar81 ^ 4)) = bVar9;
          uVar53 = (int)uVar78 + ((uint)bVar9 - (uint)*(byte *)((long)&x0 + uVar81));
          uVar78 = (ulong)uVar53;
          puVar71[uVar82] = (uchar)(uVar53 >> 2);
        }
        break;
      case 5:
        uVar78 = 0;
        for (uVar82 = 0; uVar89 != uVar82; uVar82 = uVar82 + 1) {
          bVar9 = puVar71[uVar82];
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)uVar82 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar82 + 5 & 7)) = bVar9;
          uVar78 = (ulong)((int)uVar78 + ((uint)bVar9 - (uint)bVar10));
          puVar71[uVar82] = (uchar)(uVar78 / 5);
        }
        break;
      default:
        uVar78 = 0;
        for (uVar82 = 0; uVar89 != uVar82; uVar82 = uVar82 + 1) {
          bVar9 = puVar71[uVar82];
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)uVar82 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)local_488 + (uint)uVar82 & 7)) = bVar9;
          uVar78 = (ulong)((int)uVar78 + ((uint)bVar9 - (uint)bVar10));
          puVar71[uVar82] = (uchar)(uVar78 / ((ulong)local_488 & 0xffffffff));
        }
      }
      for (; uVar65 < (uVar74 & 0xffff); uVar65 = uVar65 + 1) {
        uVar53 = (int)uVar78 - (uint)*(byte *)((long)&x0 + (ulong)((uint)uVar65 & 7));
        uVar78 = (ulong)uVar53;
        *puVar83 = (uchar)(uVar53 / (uint)local_488);
        puVar83 = puVar83 + 1;
      }
      puVar71 = puVar71 + lVar62;
      puVar92 = puVar92 + lVar62;
    }
    uVar75._0_2_ = psVar94[lVar64].x;
    uVar75._2_2_ = psVar94[lVar64].y;
    uVar74._0_2_ = psVar94[lVar64].w;
    uVar74._2_2_ = psVar94[lVar64].h;
  }
  if (1 < (byte)local_318) {
    lVar58 = (long)(int)((uVar75 >> 0x10) * local_498);
    pbVar72 = puVar55 + lVar58 + (ulong)(ushort)uVar75;
    uVar60 = (ushort)(uVar74 >> 0x10);
    x0 = 0;
    uStack_234 = 0;
    local_448._2_2_ = 0;
    iVar50 = (uint)uVar60 - local_448._0_4_;
    if (iVar50 < 0) {
      iVar50 = -1;
    }
    uVar89 = (long)iVar50 + 1;
    puVar71 = puVar55 + lVar62 * uVar89 + lVar58 + (ulong)(ushort)uVar75;
    for (uVar75 = 0; uVar78 = local_318, uVar75 != (uVar74 & 0xffff); uVar75 = uVar75 + 1) {
      memset(&x0,0,local_318);
      puVar92 = puVar71;
      uVar65 = uVar89;
      switch((int)uVar78) {
      case 2:
        uVar78 = 0;
        pbVar84 = pbVar72;
        for (uVar82 = 0; uVar89 != uVar82; uVar82 = uVar82 + 1) {
          bVar9 = *pbVar84;
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)uVar82 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar82 + 2 & 7)) = bVar9;
          uVar53 = (int)uVar78 + ((uint)bVar9 - (uint)bVar10);
          uVar78 = (ulong)uVar53;
          *pbVar84 = (byte)(uVar53 >> 1);
          pbVar84 = pbVar84 + lVar62;
        }
        break;
      case 3:
        uVar78 = 0;
        pbVar84 = pbVar72;
        for (uVar82 = 0; uVar89 != uVar82; uVar82 = uVar82 + 1) {
          bVar9 = *pbVar84;
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)uVar82 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar82 + 3 & 7)) = bVar9;
          uVar78 = (ulong)((int)uVar78 + ((uint)bVar9 - (uint)bVar10));
          *pbVar84 = (byte)(uVar78 / 3);
          pbVar84 = pbVar84 + lVar62;
        }
        break;
      case 4:
        uVar78 = 0;
        pbVar84 = pbVar72;
        for (uVar82 = 0; uVar89 != uVar82; uVar82 = uVar82 + 1) {
          bVar9 = *pbVar84;
          uVar81 = (ulong)((uint)uVar82 & 7);
          *(byte *)((long)&x0 + (uVar81 ^ 4)) = bVar9;
          uVar53 = (int)uVar78 + ((uint)bVar9 - (uint)*(byte *)((long)&x0 + uVar81));
          uVar78 = (ulong)uVar53;
          *pbVar84 = (byte)(uVar53 >> 2);
          pbVar84 = pbVar84 + lVar62;
        }
        break;
      case 5:
        uVar78 = 0;
        pbVar84 = pbVar72;
        for (uVar82 = 0; uVar89 != uVar82; uVar82 = uVar82 + 1) {
          bVar9 = *pbVar84;
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)uVar82 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar82 + 5 & 7)) = bVar9;
          uVar78 = (ulong)((int)uVar78 + ((uint)bVar9 - (uint)bVar10));
          *pbVar84 = (byte)(uVar78 / 5);
          pbVar84 = pbVar84 + lVar62;
        }
        break;
      default:
        uVar78 = 0;
        pbVar84 = pbVar72;
        for (uVar82 = 0; uVar89 != uVar82; uVar82 = uVar82 + 1) {
          bVar9 = *pbVar84;
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)uVar82 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)(ushort)local_448._0_2_ + (uint)uVar82 & 7)) = bVar9;
          uVar53 = (int)uVar78 + ((uint)bVar9 - (uint)bVar10);
          uVar78 = (ulong)uVar53;
          *pbVar84 = (byte)(uVar53 / (ushort)local_448._0_2_);
          pbVar84 = pbVar84 + lVar62;
        }
      }
      for (; uVar65 < uVar60; uVar65 = uVar65 + 1) {
        uVar53 = (int)uVar78 - (uint)*(byte *)((long)&x0 + (ulong)((uint)uVar65 & 7));
        uVar78 = (ulong)uVar53;
        *puVar92 = (uchar)(uVar53 / (uint)local_448._0_4_);
        puVar92 = puVar92 + lVar62;
      }
      pbVar72 = pbVar72 + 1;
      puVar71 = puVar71 + 1;
    }
    uVar75._0_2_ = psVar94[lVar64].x;
    uVar75._2_2_ = psVar94[lVar64].y;
    uVar74._0_2_ = psVar94[lVar64].w;
    uVar74._2_2_ = psVar94[lVar64].h;
  }
  auVar110 = (undefined1  [16])0x0;
  local_338->x0 = (short)uVar75;
  local_338->y0 = (short)(uVar75 >> 0x10);
  uVar60 = (ushort)(uVar74 >> 0x10);
  local_338->x1 = (short)uVar75 + (short)uVar74;
  local_338->y1 = (short)(uVar75 >> 0x10) + uVar60;
  local_338->xadvance = (float)(int)CONCAT11(uVar7,uVar8) * local_248;
  local_338->xoff = (float)x0_1 * local_268._0_4_ + (float)local_258._0_4_;
  local_338->yoff = (float)y0_1 * local_268._4_4_ + (float)local_258._4_4_;
  local_338->xoff2 =
       (float)(int)((uVar74 & 0xffff) + x0_1) * local_268._0_4_ + (float)local_258._0_4_;
  local_338->yoff2 = (float)(int)((uint)uVar60 + y0_1) * local_268._4_4_ + (float)local_258._4_4_;
  lVar58 = local_330;
  lVar64 = local_328;
  ptr_00 = local_348;
  psVar94 = local_2e0;
  fVar96 = (float)x0_1;
LAB_001353f2:
  lVar64 = lVar64 + 1;
  lVar58 = lVar58 + 1;
  goto LAB_00133e85;
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}